

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int extend_receive(jpeg *j,int n)

{
  byte bVar1;
  uint k;
  uint m;
  int n_local;
  jpeg *j_local;
  
  bVar1 = (byte)n;
  if (j->code_bits < n) {
    grow_buffer_unsafe(j);
  }
  j_local._4_4_ = j->code_buffer >> ((char)j->code_bits - bVar1 & 0x1f) & bmask[n];
  j->code_bits = j->code_bits - n;
  if (j_local._4_4_ < (uint)(1 << (bVar1 - 1 & 0x1f))) {
    j_local._4_4_ = (-1 << (bVar1 & 0x1f)) + j_local._4_4_ + 1;
  }
  return j_local._4_4_;
}

Assistant:

__forceinline static int extend_receive(jpeg *j, int n)
{
   unsigned int m = 1 << (n-1);
   unsigned int k;
   if (j->code_bits < n) grow_buffer_unsafe(j);
   k = (j->code_buffer >> (j->code_bits - n)) & bmask[n];
   j->code_bits -= n;
   // the following test is probably a random branch that won't
   // predict well. I tried to table accelerate it but failed.
   // maybe it's compiling as a conditional move?
   if (k < m)
      return (-1 << n) + k + 1;
   else
      return k;
}